

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,float value)

{
  float fVar1;
  int32 iVar2;
  int iVar3;
  int32 bit_count;
  int iVar4;
  bool bVar5;
  undefined1 local_2d;
  float local_2c;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  local_2c = value;
  iVar2 = WriteID(writer,type);
  if ((iVar2 == 0) && (iVar2 = SerializeInt(writer,0x84,1), fVar1 = local_2c, iVar2 == 0)) {
    iVar4 = 0x18;
    do {
      local_2d = (undefined1)((uint)fVar1 >> ((byte)iVar4 & 0x1f));
      iVar3 = (**writer->_vptr_IMkvWriter)(writer,&local_2d,1);
      if (iVar3 < 0) goto LAB_00159f88;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    iVar3 = 0;
LAB_00159f88:
    bVar5 = iVar3 == 0;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, float value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, 4))
    return false;

  if (SerializeFloat(writer, value))
    return false;

  return true;
}